

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::ItemSize(ImVec2 *size,float text_offset_y)

{
  undefined4 uVar1;
  ImVec2 IVar2;
  undefined4 uVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  pIVar5 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->Accessed = true;
  if (pIVar4->SkipItems == false) {
    fVar9 = (pIVar4->DC).CursorPos.x + size->x;
    fVar10 = (pIVar4->DC).CursorPos.y;
    fVar8 = size->y;
    (pIVar4->DC).CursorPosPrevLine.x = fVar9;
    (pIVar4->DC).CursorPosPrevLine.y = fVar10;
    IVar2 = (pIVar4->DC).CursorMaxPos;
    fVar11 = IVar2.x;
    fVar12 = IVar2.y;
    uVar1 = (pIVar4->DC).CurrentLineHeight;
    uVar3 = (pIVar4->DC).CurrentLineTextBaseOffset;
    uVar6 = -(uint)(fVar8 <= (float)uVar1);
    fVar8 = (float)(~uVar6 & (uint)fVar8 | uVar1 & uVar6);
    fVar10 = (float)(int)(fVar8 + fVar10 + (pIVar5->Style).ItemSpacing.y);
    IVar2.y = fVar10;
    IVar2.x = (float)(int)((pIVar4->Pos).x + (pIVar4->DC).IndentX + (pIVar4->DC).ColumnsOffsetX);
    (pIVar4->DC).CursorPos = IVar2;
    uVar6 = -(uint)(fVar9 <= fVar11);
    uVar7 = -(uint)(fVar10 <= fVar12);
    (pIVar4->DC).CursorMaxPos =
         (ImVec2)(CONCAT44(~uVar7 & (uint)fVar10,~uVar6 & (uint)fVar9) |
                 CONCAT44((uint)fVar12 & uVar7,(uint)fVar11 & uVar6));
    (pIVar4->DC).PrevLineHeight = fVar8;
    (pIVar4->DC).PrevLineTextBaseOffset =
         (float)(~-(uint)(text_offset_y <= (float)uVar3) & (uint)text_offset_y |
                uVar3 & -(uint)(text_offset_y <= (float)uVar3));
    (pIVar4->DC).CurrentLineHeight = 0.0;
    (pIVar4->DC).CurrentLineTextBaseOffset = 0.0;
  }
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->Accessed = true; return g.CurrentWindow; }